

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O1

void __thiscall
google::protobuf::UnknownFieldSet::DeleteSubrange(UnknownFieldSet *this,int start,int num)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  pointer pUVar4;
  long lVar5;
  ulong uVar6;
  
  if (0 < num) {
    uVar6 = (ulong)(uint)num;
    lVar5 = (long)start << 4;
    do {
      UnknownField::Delete
                ((UnknownField *)
                 ((long)&((this->fields_).
                          super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                          ._M_impl.super__Vector_impl_data._M_start)->number_ + lVar5));
      lVar5 = lVar5 + 0x10;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  uVar6 = (ulong)(start + num);
  pUVar4 = (this->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar6 < (ulong)((long)(this->fields_).
                            super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar4 >> 4)) {
    lVar5 = uVar6 << 4;
    do {
      puVar1 = (undefined8 *)((long)&pUVar4->number_ + lVar5);
      uVar3 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pUVar4[-(long)num].number_ + lVar5);
      *puVar2 = *puVar1;
      puVar2[1] = uVar3;
      uVar6 = uVar6 + 1;
      pUVar4 = (this->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x10;
    } while (uVar6 < (ulong)((long)(this->fields_).
                                   super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar4 >> 4));
  }
  if (0 < num) {
    (this->fields_).
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (this->fields_).
         super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
         ._M_impl.super__Vector_impl_data._M_finish + (-1 - (ulong)(num - 1));
  }
  return;
}

Assistant:

void UnknownFieldSet::DeleteSubrange(int start, int num) {
  // Delete the specified fields.
  for (int i = 0; i < num; ++i) {
    (fields_)[i + start].Delete();
  }
  // Slide down the remaining fields.
  for (int i = start + num; i < fields_.size(); ++i) {
    (fields_)[i - num] = (fields_)[i];
  }
  // Pop off the # of deleted fields.
  for (int i = 0; i < num; ++i) {
    fields_.pop_back();
  }
}